

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# txvalidationcache_tests.cpp
# Opt level: O0

void __thiscall Dersig100Setup::Dersig100Setup(Dersig100Setup *this)

{
  allocator_type *in_RDI;
  long in_FS_OFFSET;
  ChainType unaff_retaddr;
  TestChain100Setup *in_stack_00000008;
  TestOpts *in_stack_ffffffffffffff88;
  vector<const_char_*,_std::allocator<const_char_*>_> *in_stack_ffffffffffffffc8;
  initializer_list<const_char_*> in_stack_ffffffffffffffd0;
  TestOpts *opts;
  
  opts = *(TestOpts **)(in_FS_OFFSET + 0x28);
  std::allocator<const_char_*>::allocator((allocator<const_char_*> *)in_stack_ffffffffffffff88);
  std::vector<const_char_*,_std::allocator<const_char_*>_>::vector
            (in_stack_ffffffffffffffc8,in_stack_ffffffffffffffd0,in_RDI);
  TestChain100Setup::TestChain100Setup(in_stack_00000008,unaff_retaddr,opts);
  TestOpts::~TestOpts(in_stack_ffffffffffffff88);
  std::allocator<const_char_*>::~allocator((allocator<const_char_*> *)in_stack_ffffffffffffff88);
  if (*(TestOpts **)(in_FS_OFFSET + 0x28) == opts) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

Dersig100Setup()
        : TestChain100Setup{ChainType::REGTEST, {.extra_args = {"-testactivationheight=dersig@102"}}} {}